

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

void finish(bfgs *b)

{
  v_array<float>::delete_v(&b->predictions);
  free(b->mem);
  free(b->rho);
  free(b->alpha);
  return;
}

Assistant:

void finish(bfgs& b)
{
  b.predictions.delete_v();
  free(b.mem);
  free(b.rho);
  free(b.alpha);
}